

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  cmListFileContext *pcVar1;
  string local_38;
  
  pcVar1 = cmListFileBacktrace::Top(&this->Backtrace);
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  (__return_storage_ptr__->Name)._M_string_length = 0;
  (__return_storage_ptr__->Name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->FilePath)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->FilePath).field_2;
  (__return_storage_ptr__->FilePath)._M_string_length = 0;
  (__return_storage_ptr__->FilePath).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->Line = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->Line = pcVar1->Line;
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_38,&this->StateSnapshot);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FilePath,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  cmListFileContext const& cur = this->Backtrace.Top();
  cmListFileContext lfc;
  lfc.Name = cur.Name;
  lfc.Line = cur.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return lfc;
}